

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O0

bool __thiscall
S2MaxDistanceEdgeTarget::UpdateMinDistance
          (S2MaxDistanceEdgeTarget *this,S2Point *p,S2MaxDistance *min_dist)

{
  S1ChordAngle this_00;
  bool bVar1;
  S2MaxDistance local_38;
  S1ChordAngle local_30;
  S1ChordAngle dist;
  S2MaxDistance *min_dist_local;
  S2Point *p_local;
  S2MaxDistanceEdgeTarget *this_local;
  
  dist.length2_ = (double)min_dist;
  local_30 = S2MaxDistance::operator_cast_to_S1ChordAngle(min_dist);
  bVar1 = S2::UpdateMaxDistance(p,&this->a_,&this->b_,&local_30);
  this_00 = dist;
  if (bVar1) {
    S2MaxDistance::S2MaxDistance(&local_38,local_30);
    S2MaxDistance::UpdateMin((S2MaxDistance *)this_00.length2_,&local_38);
  }
  return bVar1;
}

Assistant:

bool S2MaxDistanceEdgeTarget::UpdateMinDistance(
    const S2Point& p, S2MaxDistance* min_dist) {
  S1ChordAngle dist(*min_dist);
  if (S2::UpdateMaxDistance(p, a_, b_, &dist)) {
    min_dist->UpdateMin(S2MaxDistance(dist));
    return true;
  }
  return false;
}